

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O3

void Js::AsmJsByteCodeDumper::Dump
               (FunctionBody *body,TypedRegisterAllocator *typedRegister,AsmJsFunc *asmFunc)

{
  int *this;
  code *pcVar1;
  byte *pbVar2;
  bool bVar3;
  Which WVar4;
  byte bVar5;
  ushort uVar6;
  OpCodeAsmJs op;
  uint32 uVar7;
  uint32 uVar8;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  undefined4 *puVar12;
  byte *pbVar13;
  ByteBlock *this_00;
  char16_t *pcVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int i;
  uint uVar18;
  undefined1 auStack_d8 [8];
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  statementReader;
  ByteCodeReader reader;
  ulong local_80;
  ulong local_78;
  LayoutSize local_68;
  uint local_64;
  AsmJsVarType var;
  uint local_5c;
  uint local_58;
  ulong local_50;
  ulong local_40;
  AsmJsVarType local_31;
  
  ByteCodeReader::Create((ByteCodeReader *)&statementReader.m_statementIndex,body,0);
  auStack_d8 = (undefined1  [8])0x0;
  statementReader.m_startLocation = (byte *)0x0;
  statementReader.m_statementMap._0_4_ = 0xffffffff;
  statementReader._12_8_ = 0;
  statementReader.m_statementMapIter.accumulatedSourceBegin = 0;
  statementReader.m_statementMapIter.accumulatedBytecodeBegin = 0;
  statementReader.m_statementMapIter.indexOfActualOffset = 0;
  statementReader.m_fullstatementMap._0_4_ = 0;
  statementReader.m_fullstatementMap._4_4_ = 0;
  statementReader.m_nextStatementBoundary._0_4_ = 0;
  statementReader.m_nextStatementBoundary._4_1_ = 1;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::Create((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            *)auStack_d8,body,0);
  FunctionBody::DumpFullFunctionName(body);
  Output::Print(L" Asm.js (");
  pvVar11 = FunctionProxy::GetAuxPtr((FunctionProxy *)body,AsmJsFunctionInfo);
  uVar16 = (ulong)*(ushort *)((long)pvVar11 + 100);
  if (uVar16 != 0) {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar17 = 0;
    do {
      uVar6 = *(ushort *)((long)pvVar11 + 100);
      if (uVar6 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar12 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                    ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                    "mArgCount != Constants::InvalidArgSlot");
        if (!bVar3) goto LAB_007cf0a3;
        *puVar12 = 0;
        uVar6 = *(ushort *)((long)pvVar11 + 100);
      }
      if (uVar6 <= uVar17) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar12 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                    ,0x3b9,"(index < mArgCount)","index < mArgCount");
        if (!bVar3) goto LAB_007cf0a3;
        *puVar12 = 0;
      }
      AsmJsVarType::AsmJsVarType
                ((AsmJsVarType *)&local_68,*(Which *)(*(long *)((long)pvVar11 + 0x68) + uVar17));
      if (uVar17 != 0) {
        Output::Print(L", ");
      }
      switch((undefined1)local_68) {
      case 0:
        pcVar14 = L"In%hu|0";
        break;
      case 1:
        pcVar14 = L"int64(In%hu)";
        break;
      case 2:
        pcVar14 = L"+In%hu";
        break;
      case 3:
        pcVar14 = L"flt(In%hu)";
        break;
      default:
        if ((byte)((undefined1)local_68 - Int32x4) < 0xb) {
          WVar4 = AsmJsVarType::which((AsmJsVarType *)&local_68);
          switch(WVar4) {
          case Int32x4:
            pcVar14 = L"I4(In%hu)";
            break;
          default:
            goto switchD_007cea6a_caseD_f;
          case Int8x16:
            pcVar14 = L"I16(In%hu)";
            break;
          case Float32x4:
            pcVar14 = L"F4(In%hu)";
            break;
          case Float64x2:
            pcVar14 = L"D2(In%hu)";
            break;
          case Int64x2:
            pcVar14 = L"I2(In%hu)";
          }
          break;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar12 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                    ,0x47,"((0))","UNREACHED");
        if (bVar3) {
          *puVar12 = 0;
          goto switchD_007cea6a_caseD_f;
        }
        goto LAB_007cf0a3;
      }
      Output::Print(pcVar14,uVar17 & 0xffffffff);
switchD_007cea6a_caseD_f:
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  Output::Print(L") ");
  uVar7 = FunctionBody::GetCountField(body,ByteCodeCount);
  uVar8 = FunctionBody::GetCountField(body,ByteCodeWithoutLDACount);
  Output::Print(L"(size: %d [%d])\n",(ulong)uVar7,(ulong)uVar8);
  if (typedRegister == (TypedRegisterAllocator *)0x0 && asmFunc != (AsmJsFunc *)0x0) {
    typedRegister = &asmFunc->mTypedRegisterAllocator;
  }
  else if (typedRegister == (TypedRegisterAllocator *)0x0) {
    bVar3 = true;
    typedRegister = (TypedRegisterAllocator *)0x0;
    goto LAB_007ceb64;
  }
  WAsmJs::TypedRegisterAllocator::DumpLocalsInfo(typedRegister);
  bVar3 = false;
LAB_007ceb64:
  if (asmFunc != (AsmJsFunc *)0x0) {
    DumpConstants(asmFunc,body);
  }
  if (!bVar3) {
    Output::Print(L"    Implicit Arg Ins:\n    ======== =====\n    ");
    WAsmJs::TypedRegisterAllocator::GetArgumentStartIndex(typedRegister,&local_68);
    if (uVar16 != 0) {
      local_78 = (ulong)local_58;
      local_40 = (ulong)_var;
      local_50 = (ulong)local_5c;
      local_80 = (ulong)local_68;
      reader.m_endLocation = (byte *)(ulong)local_64;
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar17 = 0;
      do {
        uVar6 = *(ushort *)((long)pvVar11 + 100);
        if (uVar6 == 0xffff) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                      ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                      "mArgCount != Constants::InvalidArgSlot");
          if (!bVar3) goto LAB_007cf0a3;
          *puVar12 = 0;
          uVar6 = *(ushort *)((long)pvVar11 + 100);
        }
        if (uVar6 <= uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                      ,0x3b9,"(index < mArgCount)","index < mArgCount");
          if (!bVar3) goto LAB_007cf0a3;
          *puVar12 = 0;
        }
        AsmJsVarType::AsmJsVarType(&local_31,*(Which *)(*(long *)((long)pvVar11 + 0x68) + uVar17));
        switch(local_31.which_) {
        case Int:
          Output::Print(L" I%d  In%d",local_80,uVar17 & 0xffffffff);
          local_80 = (ulong)((int)local_80 + 1);
          break;
        case Int64:
          Output::Print(L" L%d  In%d",reader.m_endLocation,uVar17 & 0xffffffff);
          reader.m_endLocation = (byte *)(ulong)((int)reader.m_endLocation + 1);
          break;
        case Double:
          Output::Print(L" D%d  In%d",local_50,uVar17 & 0xffffffff);
          local_50 = (ulong)((int)local_50 + 1);
          break;
        case Float:
          Output::Print(L" F%d  In%d",local_40,uVar17 & 0xffffffff);
          local_40 = (ulong)((int)local_40 + 1);
          break;
        default:
          if ((byte)(local_31.which_ - Int32x4) < 0xb) {
            Output::Print(L" SIMD%d  In%d",local_78,uVar17 & 0xffffffff);
            local_78 = (ulong)((int)local_78 + 1);
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar12 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                        ,0x80,"((0))","UNREACHED");
            if (!bVar3) goto LAB_007cf0a3;
            *puVar12 = 0;
          }
        }
        Output::Print(L"\n    ");
        uVar17 = uVar17 + 1;
      } while (uVar16 != uVar17);
    }
    Output::Print(L"\n");
  }
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  this = &statementReader.m_statementIndex;
  uVar7 = 0;
  while( true ) {
    pbVar2 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                              statementReader.m_fullstatementMap._0_4_);
    pbVar13 = ByteCodeReader::GetIP((ByteCodeReader *)this);
    if (pbVar2 == pbVar13) {
      do {
        FunctionBody::PrintStatementSourceLine(body,uVar7);
        uVar7 = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                ::MoveNextStatementBoundary
                          ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                            *)auStack_d8);
        pbVar2 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                                  statementReader.m_fullstatementMap._0_4_);
        pbVar13 = ByteCodeReader::GetIP((ByteCodeReader *)this);
      } while (pbVar2 == pbVar13);
    }
    uVar9 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
    op = ByteCodeReader::ReadAsmJsOp((ByteCodeReader *)this,&local_68);
    if (op == EndOfBlock) break;
    pcVar14 = L"";
    if (local_68 == MediumLayout) {
      pcVar14 = L"M-";
    }
    if (local_68 == LargeLayout) {
      pcVar14 = L"L-";
    }
    Output::Print(L"    %04x %2s",(ulong)uVar9,pcVar14);
    DumpOp(op,local_68,(ByteCodeReader *)this,body);
    if (DAT_015bc46a == '\x01') {
      uVar18 = uVar9 + 2;
      uVar10 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
      Output::SkipToColumn(0x46);
      if (local_68 == SmallLayout) {
LAB_007cef59:
        if (MaxByteSizedOpcodes < op) {
          uVar16 = 1;
          goto LAB_007cef6e;
        }
        Output::Print(L"   ");
        uVar18 = uVar9 + 1;
      }
      else {
        if (local_68 == MediumLayout) {
          iVar15 = 2;
        }
        else {
          if (local_68 != LargeLayout) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar12 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                        ,0xac,"(layoutSize == SmallLayout)",
                                        "layoutSize == SmallLayout");
            if (bVar3) {
              *puVar12 = 0;
              goto LAB_007cef59;
            }
            goto LAB_007cf0a3;
          }
          iVar15 = 4;
        }
        uVar16 = (ulong)((iVar15 + 1) - (uint)(op < InvalidOpCode));
LAB_007cef6e:
        Output::Print(L"%02X ",uVar16);
      }
      Output::Print(L"%02x",(ulong)op & 0xff);
      if ((int)uVar18 < (int)uVar10) {
        do {
          bVar5 = ByteCodeReader::GetRawByte((ByteCodeReader *)this,uVar18);
          Output::Print(L" %02x",(ulong)bVar5);
          uVar18 = uVar18 + 1;
        } while (uVar10 != uVar18);
      }
    }
    Output::Print(L"\n");
  }
  uVar9 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)&statementReader.m_statementIndex);
  this_00 = FunctionBody::GetByteCode(body);
  uVar18 = ByteBlock::GetLength(this_00);
  if (uVar9 != uVar18) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar12 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x94,
                                "(reader.GetCurrentOffset() == body->GetByteCode()->GetLength())",
                                "reader.GetCurrentOffset() == body->GetByteCode()->GetLength()");
    if (!bVar3) {
LAB_007cf0a3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar12 = 0;
  }
  pbVar2 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                            statementReader.m_fullstatementMap._0_4_);
  pbVar13 = ByteCodeReader::GetIP((ByteCodeReader *)&statementReader.m_statementIndex);
  if (pbVar2 == pbVar13) {
    FunctionBody::PrintStatementSourceLine(body,uVar7);
    StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::MoveNextStatementBoundary
              ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                *)auStack_d8);
  }
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void AsmJsByteCodeDumper::Dump(FunctionBody* body, const WAsmJs::TypedRegisterAllocator* typedRegister, AsmJsFunc* asmFunc)
    {
        ByteCodeReader reader;
        reader.Create(body);
        StatementReader<FunctionBody::StatementMapList> statementReader;
        statementReader.Create(body);
        body->DumpFullFunctionName();
        Output::Print(_u(" Asm.js ("));
        AsmJsFunctionInfo* funcInfo = body->GetAsmJsFunctionInfo();
        const ArgSlot argCount = funcInfo->GetArgCount();
        for (ArgSlot i = 0; i < argCount; i++)
        {
            AsmJsVarType var = funcInfo->GetArgType(i);
            if (i > 0)
            {
                Output::Print(_u(", "));
            }
            if (var.isDouble())
            {
                Output::Print(_u("+In%hu"), i);
            }
            else if (var.isFloat())
            {
                Output::Print(_u("flt(In%hu)"), i);
            }
            else if (var.isInt())
            {
                Output::Print(_u("In%hu|0"), i);
            }
            else if (var.isInt64())
            {
                Output::Print(_u("int64(In%hu)"), i);
            }
            else if (var.isSIMD())
            {
                switch (var.which())
                {
                case AsmJsType::Int32x4:
                    Output::Print(_u("I4(In%hu)"), i);
                    break;
                case AsmJsType::Int8x16:
                    Output::Print(_u("I16(In%hu)"), i);
                    break;
                case AsmJsType::Float32x4:
                    Output::Print(_u("F4(In%hu)"), i);
                    break;
                case AsmJsType::Float64x2:
                    Output::Print(_u("D2(In%hu)"), i);
                    break;
                case AsmJsType::Int64x2:
                    Output::Print(_u("I2(In%hu)"), i);
                    break;
                }
            }
            else
            {
                Assert(UNREACHED);
            }
        }

        Output::Print(_u(") "));
        Output::Print(_u("(size: %d [%d])\n"), body->GetByteCodeCount(), body->GetByteCodeWithoutLDACount());

        if (!typedRegister && asmFunc)
        {
            typedRegister = &asmFunc->GetTypedRegisterAllocator();
        }

        if (typedRegister)
        {
            typedRegister->DumpLocalsInfo();
        }

        if (asmFunc)
        {
            DumpConstants(asmFunc, body);
        }

        if (typedRegister)
        {
            Output::Print(_u("    Implicit Arg Ins:\n    ======== =====\n    "));
            uint32 iArgs[WAsmJs::LIMIT];
            typedRegister->GetArgumentStartIndex(iArgs);
            uint32 iArg = iArgs[WAsmJs::INT32];
            uint32 lArg = iArgs[WAsmJs::INT64];
            uint32 dArg = iArgs[WAsmJs::FLOAT64];
            uint32 fArg = iArgs[WAsmJs::FLOAT32];
            uint32 simdArg = iArgs[WAsmJs::SIMD];
            for (ArgSlot i = 0; i < argCount; i++)
            {
                AsmJsVarType var = funcInfo->GetArgType(i);
                if (var.isDouble())
                {
                    Output::Print(_u(" D%d  In%d"), dArg++, i);
                }
                else if (var.isFloat())
                {
                    Output::Print(_u(" F%d  In%d"), fArg++, i);
                }
                else if (var.isInt())
                {
                    Output::Print(_u(" I%d  In%d"), iArg++, i);
                }
                else if (var.isInt64())
                {
                    Output::Print(_u(" L%d  In%d"), lArg++, i);
                }
                else if (var.isSIMD())
                {
                    Output::Print(_u(" SIMD%d  In%d"), simdArg++, i);
                }
                else
                {
                    Assert(UNREACHED);
                }
                Output::Print(_u("\n    "));
            }
            Output::Print(_u("\n"));
        }

        uint32 statementIndex = 0;
        while (true)
        {
            while (statementReader.AtStatementBoundary(&reader))
            {
                body->PrintStatementSourceLine(statementIndex);
                statementIndex = statementReader.MoveNextStatementBoundary();
            }
            int byteOffset = reader.GetCurrentOffset();
            LayoutSize layoutSize;
            OpCodeAsmJs op = reader.ReadAsmJsOp(layoutSize);
            if (op == OpCodeAsmJs::EndOfBlock)
            {
                Assert(reader.GetCurrentOffset() == body->GetByteCode()->GetLength());
                break;
            }
            Output::Print(_u("    %04x %2s"), byteOffset, layoutSize == LargeLayout ? _u("L-") : layoutSize == MediumLayout ? _u("M-") : _u(""));
            DumpOp(op, layoutSize, reader, body);
            if (Js::Configuration::Global.flags.Verbose)
            {
                int layoutStart = byteOffset + 2; // Account for the prefix op
                int endByteOffset = reader.GetCurrentOffset();
                Output::SkipToColumn(70);
                if (layoutSize == LargeLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCodeAsmJs::MaxByteSizedOpcodes ?
                        Js::OpCodeAsmJs::ExtendedLargeLayoutPrefix : Js::OpCodeAsmJs::LargeLayoutPrefix);
                }
                else if (layoutSize == MediumLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCodeAsmJs::MaxByteSizedOpcodes ?
                        Js::OpCodeAsmJs::ExtendedMediumLayoutPrefix : Js::OpCodeAsmJs::MediumLayoutPrefix);
                }
                else
                {
                    Assert(layoutSize == SmallLayout);
                    if (op > Js::OpCodeAsmJs::MaxByteSizedOpcodes)
                    {
                        Output::Print(_u("%02X "), Js::OpCodeAsmJs::ExtendedOpcodePrefix);
                    }
                    else
                    {
                        Output::Print(_u("   "));
                        layoutStart--; // don't have a prefix
                    }
                }

                Output::Print(_u("%02x"), (byte)op);
                for (int i = layoutStart; i < endByteOffset; i++)
                {
                    Output::Print(_u(" %02x"), reader.GetRawByte(i));
                }
            }
            Output::Print(_u("\n"));
        }
        if (statementReader.AtStatementBoundary(&reader))
        {
            body->PrintStatementSourceLine(statementIndex);
            statementIndex = statementReader.MoveNextStatementBoundary();
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }